

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O2

void __thiscall
DP::SimpleCongruenceClosure::getUnsatCore
          (SimpleCongruenceClosure *this,LiteralStack *res,uint coreIndex)

{
  CEq *pCVar1;
  CEq *pCVar2;
  Literal *pLVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  ConstInfo *pCVar5;
  ConstInfo *pCVar6;
  CPair CVar7;
  CPair CVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint c1;
  IntUnionFind explained;
  IntUnionFind local_68;
  
  pCVar2 = (this->_unsatEqs)._stack;
  pCVar1 = pCVar2 + coreIndex;
  pVar4.first = pCVar1->c1;
  pVar4.second = pCVar1->c2;
  pLVar3 = pCVar2[coreIndex].foPremise;
  if (pLVar3 != (Literal *)0x0) {
    Lib::Stack<Kernel::Literal_*>::push(res,pLVar3);
  }
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain == '\0') {
    iVar9 = __cxa_guard_acquire(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain
                               );
    if (iVar9 != 0) {
      getUnsatCore::toExplain._cursor = (pair<unsigned_int,_unsigned_int> *)0x0;
      getUnsatCore::toExplain._end = (pair<unsigned_int,_unsigned_int> *)0x0;
      getUnsatCore::toExplain._capacity = 0;
      getUnsatCore::toExplain._stack = (pair<unsigned_int,_unsigned_int> *)0x0;
      __cxa_atexit(Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::~Stack,
                   &getUnsatCore::toExplain,&__dso_handle);
      __cxa_guard_release(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain);
    }
  }
  Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push(&getUnsatCore::toExplain,pVar4);
  Lib::IntUnionFind::IntUnionFind(&local_68,(int)(this->_cInfos)._size);
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack == '\0') {
    iVar9 = __cxa_guard_acquire(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack
                               );
    if (iVar9 != 0) {
      getUnsatCore::pathStack._cursor = (uint *)0x0;
      getUnsatCore::pathStack._end = (uint *)0x0;
      getUnsatCore::pathStack._capacity = 0;
      getUnsatCore::pathStack._stack = (uint *)0x0;
      __cxa_atexit(Lib::Stack<unsigned_int>::~Stack,&getUnsatCore::pathStack,&__dso_handle);
      __cxa_guard_release(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack);
    }
  }
  while (getUnsatCore::toExplain._cursor != getUnsatCore::toExplain._stack) {
    pVar4 = getUnsatCore::toExplain._cursor[-1];
    c1 = pVar4.first;
    getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + -1;
    iVar9 = Lib::IntUnionFind::root(&local_68,c1);
    uVar11 = pVar4.second;
    iVar10 = Lib::IntUnionFind::root(&local_68,uVar11);
    if (iVar9 != iVar10) {
      getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._stack;
      collectUnifyingPath(this,c1,uVar11,&getUnsatCore::pathStack);
      while (getUnsatCore::pathStack._cursor != getUnsatCore::pathStack._stack) {
        uVar11 = getUnsatCore::pathStack._cursor[-1];
        pCVar5 = (this->_cInfos)._array;
        getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._cursor + -1;
        iVar9 = Lib::IntUnionFind::root(&local_68,pCVar5[uVar11].predecessorPremise.c1);
        iVar10 = Lib::IntUnionFind::root(&local_68,pCVar5[uVar11].predecessorPremise.c2);
        if (iVar9 != iVar10) {
          if (pCVar5[uVar11].predecessorPremise.foOrigin == true) {
            pLVar3 = pCVar5[uVar11].predecessorPremise.foPremise;
            if (pLVar3 != (Literal *)0x0) {
              Lib::Stack<Kernel::Literal_*>::push(res,pLVar3);
            }
          }
          else {
            pCVar6 = (this->_cInfos)._array;
            CVar7 = pCVar6[pCVar5[uVar11].predecessorPremise.c1].namedPair;
            CVar8 = pCVar6[pCVar5[uVar11].predecessorPremise.c2].namedPair;
            Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push
                      (&getUnsatCore::toExplain,
                       (pair<unsigned_int,_unsigned_int>)
                       ((ulong)CVar7 & 0xffffffff | (long)CVar8 << 0x20));
            Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push
                      (&getUnsatCore::toExplain,
                       (pair<unsigned_int,_unsigned_int>)
                       ((ulong)CVar7 >> 0x20 | (ulong)CVar8 & 0xffffffff00000000));
          }
          Lib::IntUnionFind::doUnion
                    (&local_68,pCVar5[uVar11].predecessorPremise.c1,
                     pCVar5[uVar11].predecessorPremise.c2);
        }
      }
    }
  }
  Lib::IntUnionFind::~IntUnionFind(&local_68);
  return;
}

Assistant:

void SimpleCongruenceClosure::getUnsatCore(LiteralStack& res, unsigned coreIndex)
{
  ASS(res.isEmpty());
  ASS_L(coreIndex,_unsatEqs.size());

  CEq unsatEq = _unsatEqs[coreIndex];

  ASS(unsatEq.foOrigin);
  if(unsatEq.foPremise) {
    res.push(unsatEq.foPremise);
  }

  static Stack<CPair> toExplain;
  toExplain.push(CPair(unsatEq.c1, unsatEq.c2));
  ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));

  IntUnionFind explained(getMaxConst()+1);
  static Stack<unsigned> pathStack;

  while(toExplain.isNonEmpty()) {
    CPair curr = toExplain.pop();
    ASS_EQ(deref(curr.first), deref(curr.second));

    if(explained.root(curr.first)==explained.root(curr.second)) {
      //we've already explained this equality
      continue;
    }
    pathStack.reset();
    // put into pathStack constants whose premises imply the equality
    collectUnifyingPath(curr.first, curr.second, pathStack);
    while(pathStack.isNonEmpty()) {
      unsigned proofStepConst = pathStack.pop();
      CEq& prem = _cInfos[proofStepConst].predecessorPremise;
      if(explained.root(prem.c1)==explained.root(prem.c2)) {
        //we've already explained this equality
        continue;
      }
      if(prem.foOrigin) {
	if(prem.foPremise) {
	  res.push(prem.foPremise);
	} // Martin: this should be only null for the "built-in" dis-equality (_posLitConst != _negLitConst)
      }
      else {
	//the equality was implied by congruence between the following two pairs:
	CPair cp1 = _cInfos[prem.c1].namedPair;
	CPair cp2 = _cInfos[prem.c2].namedPair;
	ASS_NEQ(cp1.first,0);
	ASS_NEQ(cp1.second,0);
	ASS_NEQ(cp2.first,0);
	ASS_NEQ(cp2.second,0);
	toExplain.push(CPair(cp1.first, cp2.first));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
	toExplain.push(CPair(cp1.second, cp2.second));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
      }
      explained.doUnion(prem.c1, prem.c2);
    }
  }
}